

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::CheckboxFlagsT<unsigned_int>(char *label,uint *flags,uint flags_value)

{
  ImGuiItemFlags IVar1;
  ImGuiWindow *pIVar2;
  uint in_EDX;
  uint *in_RSI;
  bool bVar3;
  ImGuiItemFlags backup_item_flags;
  ImGuiWindow *window;
  bool pressed;
  bool any_on;
  bool all_on;
  bool *in_stack_00000120;
  char *in_stack_00000128;
  bool local_17;
  
  bVar3 = (*in_RSI & in_EDX) == in_EDX;
  if ((bVar3) || ((*in_RSI & in_EDX) == 0)) {
    local_17 = Checkbox(in_stack_00000128,in_stack_00000120);
  }
  else {
    pIVar2 = GetCurrentWindow();
    IVar1 = (pIVar2->DC).ItemFlags;
    (pIVar2->DC).ItemFlags = (pIVar2->DC).ItemFlags | 0x40;
    local_17 = Checkbox(in_stack_00000128,in_stack_00000120);
    (pIVar2->DC).ItemFlags = IVar1;
  }
  if (local_17 != false) {
    if (bVar3) {
      *in_RSI = in_EDX | *in_RSI;
    }
    else {
      *in_RSI = (in_EDX ^ 0xffffffff) & *in_RSI;
    }
  }
  return local_17;
}

Assistant:

bool ImGui::CheckboxFlagsT(const char* label, T* flags, T flags_value)
{
    bool all_on = (*flags & flags_value) == flags_value;
    bool any_on = (*flags & flags_value) != 0;
    bool pressed;
    if (!all_on && any_on)
    {
        ImGuiWindow* window = GetCurrentWindow();
        ImGuiItemFlags backup_item_flags = window->DC.ItemFlags;
        window->DC.ItemFlags |= ImGuiItemFlags_MixedValue;
        pressed = Checkbox(label, &all_on);
        window->DC.ItemFlags = backup_item_flags;
    }
    else
    {
        pressed = Checkbox(label, &all_on);

    }
    if (pressed)
    {
        if (all_on)
            *flags |= flags_value;
        else
            *flags &= ~flags_value;
    }
    return pressed;
}